

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

Symbol __thiscall google::protobuf::DescriptorPool::Tables::FindSymbol(Tables *this,string_view key)

{
  bool bVar1;
  reference pvVar2;
  iterator local_58;
  key_arg<google::protobuf::(anonymous_namespace)::FullNameQuery> local_48;
  undefined1 local_38 [8];
  const_iterator it;
  Tables *this_local;
  string_view key_local;
  
  local_48.query._M_str = key._M_str;
  local_48.query._M_len = key._M_len;
  it.inner_.field_1 = (anon_union_8_1_a8a14541_for_iterator_2)this;
  key_local._M_len = (size_t)local_48.query._M_str;
  _local_38 = (iterator)
              absl::lts_20240722::container_internal::
              raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
              ::find<google::protobuf::(anonymous_namespace)::FullNameQuery>
                        (&(this->symbols_by_name_).
                          super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                         ,&local_48);
  local_58 = (iterator)
             absl::lts_20240722::container_internal::
             raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
             ::end(&(this->symbols_by_name_).
                    super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                  );
  bVar1 = absl::lts_20240722::container_internal::operator==
                    ((const_iterator *)local_38,(const_iterator *)&local_58);
  if (bVar1) {
    Symbol::Symbol((Symbol *)&key_local._M_str);
  }
  else {
    pvVar2 = absl::lts_20240722::container_internal::
             raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
             ::const_iterator::operator*((const_iterator *)local_38);
    key_local._M_str = (char *)pvVar2->ptr_;
  }
  return (Symbol)(SymbolBase *)key_local._M_str;
}

Assistant:

inline Symbol DescriptorPool::Tables::FindSymbol(absl::string_view key) const {
  auto it = symbols_by_name_.find(FullNameQuery{key});
  return it == symbols_by_name_.end() ? Symbol() : *it;
}